

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messaging.c
# Opt level: O3

AMQP_VALUE messaging_delivery_rejected(char *error_condition,char *error_description)

{
  int iVar1;
  REJECTED_HANDLE rejected;
  ERROR_HANDLE error;
  LOGGER_LOG p_Var2;
  AMQP_VALUE pAVar3;
  char *pcVar4;
  
  rejected = rejected_create();
  if (rejected == (REJECTED_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/messaging.c"
                ,"messaging_delivery_rejected",0xa5,1,"Cannot create REJECTED delivery state handle"
               );
      return (AMQP_VALUE)0x0;
    }
    return (AMQP_VALUE)0x0;
  }
  if (error_condition == (char *)0x0) {
LAB_00116f0f:
    pAVar3 = amqpvalue_create_rejected(rejected);
    if (pAVar3 != (AMQP_VALUE)0x0) goto LAB_00116f5b;
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      pcVar4 = "Cannot create REJECTED delivery state AMQP value";
      iVar1 = 0xd3;
LAB_00116f4b:
      pAVar3 = (AMQP_VALUE)0x0;
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/messaging.c"
                ,"messaging_delivery_rejected",iVar1,1,pcVar4);
      goto LAB_00116f5b;
    }
  }
  else {
    error = error_create(error_condition);
    if (error == (ERROR_HANDLE)0x0) {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        pcVar4 = "Cannot create error AMQP value for REJECTED state";
        iVar1 = 0xb2;
        goto LAB_00116f4b;
      }
    }
    else {
      if ((error_description == (char *)0x0) ||
         (iVar1 = error_set_description(error,error_description), iVar1 == 0)) {
        iVar1 = rejected_set_error(rejected,error);
        if (iVar1 == 0) {
          error_destroy(error);
          goto LAB_00116f0f;
        }
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          pcVar4 = "Cannot set error on REJECTED state handle";
          iVar1 = 0xc1;
          goto LAB_00116ebc;
        }
      }
      else {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          pcVar4 = "Cannot set error description on error AMQP value for REJECTED state";
          iVar1 = 0xba;
LAB_00116ebc:
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/messaging.c"
                    ,"messaging_delivery_rejected",iVar1,1,pcVar4);
        }
      }
      error_destroy(error);
    }
  }
  pAVar3 = (AMQP_VALUE)0x0;
LAB_00116f5b:
  rejected_destroy(rejected);
  return pAVar3;
}

Assistant:

AMQP_VALUE messaging_delivery_rejected(const char* error_condition, const char* error_description)
{
    AMQP_VALUE result;
    REJECTED_HANDLE rejected = rejected_create();
    if (rejected == NULL)
    {
        LogError("Cannot create REJECTED delivery state handle");
        result = NULL;
    }
    else
    {
        ERROR_HANDLE error_handle = NULL;
        bool error_constructing = false;

        if (error_condition != NULL)
        {
            error_handle = error_create(error_condition);
            if (error_handle == NULL)
            {
                LogError("Cannot create error AMQP value for REJECTED state");
                error_constructing = true;
            }
            else
            {
                if ((error_description != NULL) &&
                    (error_set_description(error_handle, error_description) != 0))
                {
                    LogError("Cannot set error description on error AMQP value for REJECTED state");
                    error_constructing = true;
                }
                else
                {
                    if (rejected_set_error(rejected, error_handle) != 0)
                    {
                        LogError("Cannot set error on REJECTED state handle");
                        error_constructing = true;
                    }
                }

                error_destroy(error_handle);
            }
        }

        if (error_constructing)
        {
            result = NULL;
        }
        else
        {
            result = amqpvalue_create_rejected(rejected);
            if (result == NULL)
            {
                LogError("Cannot create REJECTED delivery state AMQP value");
            }
            else
            {
                /* all ok */
            }
        }

        rejected_destroy(rejected);
    }

    return result;
}